

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O0

int Sbd_ManMergeCuts(Sbd_Man_t *p,int Node)

{
  int iVar1;
  int i;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Gia_Obj_t *pGVar6;
  int *piVar7;
  int *pCut2;
  int local_17c;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  int *piStack_160;
  int LevCur;
  int *pCutRes;
  int Lev00;
  int Lev10;
  int Lev01;
  int Lev11;
  int nSize00;
  int nSize10;
  int nSize01;
  int nSize11;
  int Cut1 [2];
  int Cut0 [2];
  int *pCut1;
  int *pCut0;
  int Level1;
  int Level0;
  int iFan1;
  int iFan0;
  int pCut00 [13];
  int local_c8 [2];
  int pCut10 [13];
  int local_88 [2];
  int pCut01 [13];
  int local_48 [2];
  int pCut11 [13];
  int Node_local;
  Sbd_Man_t *p_local;
  
  pCut11[0xb] = Node;
  unique0x10000350 = p;
  pGVar6 = Gia_ManObj(p->pGia,Node);
  iVar1 = Gia_ObjFaninId0(pGVar6,pCut11[0xb]);
  pGVar6 = Gia_ManObj(stack0xfffffffffffffff0->pGia,pCut11[0xb]);
  i = Gia_ObjFaninId1(pGVar6,pCut11[0xb]);
  iVar2 = Vec_IntEntry(stack0xfffffffffffffff0->vLutLevs,iVar1);
  if (iVar2 == 0) {
    local_168 = 1;
  }
  else {
    local_168 = Vec_IntEntry(stack0xfffffffffffffff0->vLutLevs,iVar1);
  }
  iVar2 = Vec_IntEntry(stack0xfffffffffffffff0->vLutLevs,i);
  if (iVar2 == 0) {
    local_16c = 1;
  }
  else {
    local_16c = Vec_IntEntry(stack0xfffffffffffffff0->vLutLevs,i);
  }
  piVar7 = Sbd_ObjCut(stack0xfffffffffffffff0,iVar1);
  pCut2 = Sbd_ObjCut(stack0xfffffffffffffff0,i);
  Cut1[0] = 1;
  nSize01 = 1;
  nSize11 = i;
  Cut1[1] = iVar1;
  iVar2 = Sbd_CutMergeSimple(stack0xfffffffffffffff0,piVar7,pCut2,local_48);
  iVar3 = Sbd_CutMergeSimple(stack0xfffffffffffffff0,Cut1,pCut2,local_88);
  iVar4 = Sbd_CutMergeSimple(stack0xfffffffffffffff0,piVar7,&nSize01,local_c8);
  iVar5 = Sbd_CutMergeSimple(stack0xfffffffffffffff0,Cut1,&nSize01,&iFan1);
  if (stack0xfffffffffffffff0->pPars->nLutSize < iVar2) {
    local_170 = 1000000000;
  }
  else {
    local_170 = Abc_MaxInt(local_168,local_16c);
  }
  if (stack0xfffffffffffffff0->pPars->nLutSize < iVar3) {
    local_174 = 1000000000;
  }
  else {
    local_174 = Abc_MaxInt(local_168 + 1,local_16c);
  }
  if (stack0xfffffffffffffff0->pPars->nLutSize < iVar4) {
    local_178 = 1000000000;
  }
  else {
    local_178 = Abc_MaxInt(local_168,local_16c + 1);
  }
  if (stack0xfffffffffffffff0->pPars->nLutSize < iVar5) {
    local_17c = 1000000000;
  }
  else {
    local_17c = Abc_MaxInt(local_168 + 1,local_16c + 1);
  }
  piStack_160 = local_48;
  local_164 = local_170;
  if ((local_174 < local_170) || ((local_174 == local_170 && (local_88[0] < local_48[0])))) {
    piStack_160 = local_88;
    local_164 = local_174;
  }
  if ((local_178 < local_164) || ((local_178 == local_164 && (local_c8[0] < *piStack_160)))) {
    piStack_160 = local_c8;
    local_164 = local_178;
  }
  if ((local_17c < local_164) || ((local_17c == local_164 && (iFan1 < *piStack_160)))) {
    piStack_160 = &iFan1;
    local_164 = local_17c;
  }
  if (iVar1 == i) {
    __assert_fail("iFan0 != iFan1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                  ,0x6ad,"int Sbd_ManMergeCuts(Sbd_Man_t *, int)");
  }
  iVar1 = Vec_IntEntry(stack0xfffffffffffffff0->vLutLevs,pCut11[0xb]);
  if (iVar1 != 0) {
    __assert_fail("Vec_IntEntry(p->vLutLevs, Node) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                  ,0x6ae,"int Sbd_ManMergeCuts(Sbd_Man_t *, int)");
  }
  Vec_IntWriteEntry(stack0xfffffffffffffff0->vLutLevs,pCut11[0xb],local_164);
  if (*piStack_160 <= stack0xfffffffffffffff0->pPars->nLutSize) {
    piVar7 = Sbd_ObjCut(stack0xfffffffffffffff0,pCut11[0xb]);
    memcpy(piVar7,piStack_160,(long)(*piStack_160 + 1) << 2);
    return (int)(local_164 == 1);
  }
  __assert_fail("pCutRes[0] <= p->pPars->nLutSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                ,0x6b1,"int Sbd_ManMergeCuts(Sbd_Man_t *, int)");
}

Assistant:

int Sbd_ManMergeCuts( Sbd_Man_t * p, int Node )
{
    int pCut11[2*SBD_MAX_LUTSIZE+1];     
    int pCut01[2*SBD_MAX_LUTSIZE+1];     
    int pCut10[2*SBD_MAX_LUTSIZE+1];     
    int pCut00[2*SBD_MAX_LUTSIZE+1];     
    int iFan0   = Gia_ObjFaninId0( Gia_ManObj(p->pGia, Node), Node );
    int iFan1   = Gia_ObjFaninId1( Gia_ManObj(p->pGia, Node), Node );
    int Level0  = Vec_IntEntry( p->vLutLevs, iFan0 ) ? Vec_IntEntry( p->vLutLevs, iFan0 ) : 1;
    int Level1  = Vec_IntEntry( p->vLutLevs, iFan1 ) ? Vec_IntEntry( p->vLutLevs, iFan1 ) : 1;
    int * pCut0 = Sbd_ObjCut( p, iFan0 );
    int * pCut1 = Sbd_ObjCut( p, iFan1 );
    int Cut0[2] = {1, iFan0}; 
    int Cut1[2] = {1, iFan1}; 
    int nSize11 = Sbd_CutMergeSimple( p, pCut0, pCut1, pCut11 );
    int nSize01 = Sbd_CutMergeSimple( p,  Cut0, pCut1, pCut01 );
    int nSize10 = Sbd_CutMergeSimple( p, pCut0,  Cut1, pCut10 );
    int nSize00 = Sbd_CutMergeSimple( p,  Cut0,  Cut1, pCut00 );
    int Lev11   = nSize11 <= p->pPars->nLutSize ? Abc_MaxInt(Level0,   Level1)   : ABC_INFINITY;
    int Lev01   = nSize01 <= p->pPars->nLutSize ? Abc_MaxInt(Level0+1, Level1)   : ABC_INFINITY;
    int Lev10   = nSize10 <= p->pPars->nLutSize ? Abc_MaxInt(Level0,   Level1+1) : ABC_INFINITY;
    int Lev00   = nSize00 <= p->pPars->nLutSize ? Abc_MaxInt(Level0+1, Level1+1) : ABC_INFINITY;
    int * pCutRes = pCut11;
    int LevCur    = Lev11;
    if ( Lev01 < LevCur || (Lev01 == LevCur && pCut01[0] < pCutRes[0]) )
    {
        pCutRes = pCut01;
        LevCur  = Lev01;
    }
    if ( Lev10 < LevCur || (Lev10 == LevCur && pCut10[0] < pCutRes[0]) )
    {
        pCutRes = pCut10;
        LevCur  = Lev10;
    }
    if ( Lev00 < LevCur || (Lev00 == LevCur && pCut00[0] < pCutRes[0]) )
    {
        pCutRes = pCut00;
        LevCur  = Lev00;
    }
    assert( iFan0 != iFan1 );
    assert( Vec_IntEntry(p->vLutLevs, Node) == 0 );
    Vec_IntWriteEntry( p->vLutLevs, Node, LevCur );
    //Vec_IntWriteEntry( p->vLevs, Node, 1+Abc_MaxInt(Vec_IntEntry(p->vLevs, iFan0), Vec_IntEntry(p->vLevs, iFan1)) );
    assert( pCutRes[0] <= p->pPars->nLutSize );
    memcpy( Sbd_ObjCut(p, Node), pCutRes, sizeof(int) * (pCutRes[0] + 1) );
//printf( "Setting node %d with delay %d.\n", Node, LevCur );
    return LevCur == 1; // LevCur == Abc_MaxInt(Level0, Level1);
}